

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyle::Internal_SetIntMember(ON_DimStyle *this,field field_id,int value,int *class_member)

{
  int iVar1;
  
  iVar1 = *class_member;
  if (iVar1 != value) {
    *class_member = value;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return iVar1 != value;
}

Assistant:

bool ON_DimStyle::Internal_SetIntMember(
  ON_DimStyle::field field_id,
  int value,
  int& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}